

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O3

void tlbi_aa64_vmalle1is_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  uint16_t idxmap;
  
  if ((((env->features & 0x200000000) == 0) || (idxmap = 0x380, ((env->cp15).scr_el3 & 1) != 0)) &&
     (idxmap = 0xd, (~(env->cp15).hcr_el2 & 0x408000000) == 0)) {
    idxmap = 0x62;
  }
  tlb_flush_by_mmuidx_all_cpus_synced_aarch64((CPUState *)(env[-4].vfp.zregs[0x17].d + 0x14),idxmap)
  ;
  return;
}

Assistant:

static inline bool arm_is_secure_below_el3(CPUARMState *env)
{
    if (arm_feature(env, ARM_FEATURE_EL3)) {
        return !(env->cp15.scr_el3 & SCR_NS);
    } else {
        /* If EL3 is not supported then the secure state is implementation
         * defined, in which case QEMU defaults to non-secure.
         */
        return false;
    }
}